

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_compress_symbolic.cpp
# Opt level: O2

bool realign_weights_undecimated
               (astcenc_profile decode_mode,block_size_descriptor *bsd,image_block *blk,
               symbolic_compressed_block *scb)

{
  undefined1 auVar1 [16];
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  bool bVar10;
  int iVar11;
  partition_info *ppVar12;
  block_mode *pbVar13;
  vint4 *output0;
  vint4 *output1;
  ulong uVar14;
  uint8_t *puVar15;
  anon_union_32_2_267bb92b_for_symbolic_compressed_block_9 *input;
  long lVar16;
  byte bVar17;
  char *__assertion;
  uint uVar18;
  undefined1 auVar19 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar30;
  float fVar31;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar32;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  bool alpha_hdr;
  bool rgb_hdr;
  uint local_170;
  astcenc_profile local_16c;
  anon_union_32_2_267bb92b_for_symbolic_compressed_block_9 *local_168;
  ulong local_160;
  ulong local_158;
  vint4 *local_150;
  undefined1 local_148 [16];
  vfloat4 offset [4];
  vfloat4 endpnt0f [4];
  vint4 endpnt1 [4];
  vint4 endpnt0 [4];
  undefined1 auVar20 [64];
  
  bVar2 = scb->partition_count;
  local_16c = decode_mode;
  ppVar12 = block_size_descriptor::get_partition_info(bsd,(uint)bVar2,(uint)scb->partition_index);
  pbVar13 = block_size_descriptor::get_block_mode(bsd,(uint)scb->block_mode);
  if (bVar2 == 0) {
    __assertion = "partition_count > 0";
    uVar18 = 0x60;
  }
  else {
    local_170 = (byte)pbVar13->field_0x5 & 1;
    local_160 = (ulong)pbVar13->quant_mode;
    iVar11 = (int)scb->plane2_component;
    auVar19._4_4_ = iVar11;
    auVar19._0_4_ = iVar11;
    auVar19._8_4_ = iVar11;
    auVar19._12_4_ = iVar11;
    auVar20 = ZEXT1664(auVar19);
    local_148 = vpcmpeqd_avx(auVar19,_DAT_002f8df0);
    input = &scb->field_9;
    output0 = endpnt0;
    output1 = endpnt1;
    uVar14 = 0;
    while (bVar2 != uVar14) {
      local_168 = input;
      local_158 = uVar14;
      local_150 = output1;
      unpack_color_endpoints
                (local_16c,(uint)scb->color_formats[uVar14],(uint8_t *)input->constant_color,
                 &rgb_hdr,&alpha_hdr,output0,output1);
      input = (anon_union_32_2_267bb92b_for_symbolic_compressed_block_9 *)
              (local_168->constant_color + 2);
      output0 = output0 + 1;
      output1 = local_150 + 1;
      uVar14 = local_158 + 1;
    }
    puVar15 = scb->weights;
    iVar11 = 0;
    auVar19 = vpcmpeqd_avx(auVar20._0_16_,auVar20._0_16_);
    bVar10 = false;
    auVar5 = local_148;
    while( true ) {
      if (iVar11 == local_170 + 1) {
        return bVar10;
      }
      for (lVar16 = 0; (ulong)bVar2 * 0x10 != lVar16; lVar16 = lVar16 + 0x10) {
        auVar1 = *(undefined1 (*) [16])((long)endpnt0[0].m + lVar16);
        auVar22 = vpsubd_avx(*(undefined1 (*) [16])((long)endpnt1[0].m + lVar16),auVar1);
        auVar22 = vpblendvb_avx(auVar22,(undefined1  [16])0x0,auVar5);
        auVar1 = vcvtdq2ps_avx(auVar1);
        *(undefined1 (*) [16])((long)endpnt0f[0].m + lVar16) = auVar1;
        auVar1 = vcvtdq2ps_avx(auVar22);
        auVar22._0_4_ = auVar1._0_4_ * 0.015625;
        auVar22._4_4_ = auVar1._4_4_ * 0.015625;
        auVar22._8_4_ = auVar1._8_4_ * 0.015625;
        auVar22._12_4_ = auVar1._12_4_ * 0.015625;
        *(undefined1 (*) [16])((long)offset[0].m + lVar16) = auVar22;
      }
      bVar17 = bsd->texel_count;
      if (bVar17 == 0) break;
      for (uVar14 = 0; uVar14 < bVar17; uVar14 = uVar14 + 1) {
        bVar17 = puVar15[uVar14];
        uVar4 = *(ushort *)(local_160 * 0xe2 + 0x318f90 + (ulong)bVar17 * 2);
        fVar21 = (float)bVar17;
        fVar26 = (float)(int)((uint)(byte)uVar4 - (uint)bVar17);
        fVar32 = (float)(int)((uint)(uVar4 >> 8) - (uint)bVar17);
        bVar3 = ppVar12->partition_of_texel[uVar14];
        fVar6 = offset[bVar3].m[0];
        fVar7 = offset[bVar3].m[1];
        fVar8 = offset[bVar3].m[2];
        fVar9 = offset[bVar3].m[3];
        auVar23._0_4_ = fVar6 * fVar21 + endpnt0f[bVar3].m[0];
        auVar23._4_4_ = fVar7 * fVar21 + endpnt0f[bVar3].m[1];
        auVar23._8_4_ = fVar8 * fVar21 + endpnt0f[bVar3].m[2];
        auVar23._12_4_ = fVar9 * fVar21 + endpnt0f[bVar3].m[3];
        auVar1 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar14]),ZEXT416((uint)blk->data_g[uVar14])
                               ,0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)blk->data_b[uVar14]),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)blk->data_a[uVar14]),0x30);
        auVar22 = vsubps_avx(auVar23,auVar1);
        auVar1 = *(undefined1 (*) [16])(blk->channel_weight).m;
        fVar21 = auVar22._0_4_;
        fVar35 = auVar22._4_4_;
        fVar36 = auVar22._8_4_;
        fVar37 = auVar22._12_4_;
        fVar38 = auVar1._0_4_;
        auVar24._0_4_ = fVar38 * fVar21 * fVar21;
        fVar39 = auVar1._4_4_;
        auVar24._4_4_ = fVar39 * fVar35 * fVar35;
        fVar40 = auVar1._8_4_;
        auVar24._8_4_ = fVar40 * fVar36 * fVar36;
        fVar41 = auVar1._12_4_;
        auVar24._12_4_ = fVar41 * fVar37 * fVar37;
        auVar1 = vshufpd_avx(auVar24,auVar24,1);
        auVar25._0_4_ = auVar1._0_4_ + auVar24._0_4_;
        auVar25._4_4_ = auVar1._4_4_ + auVar24._4_4_;
        auVar25._8_4_ = auVar1._8_4_ + auVar24._8_4_;
        auVar25._12_4_ = auVar1._12_4_ + auVar24._12_4_;
        fVar27 = fVar6 * fVar26 + fVar21;
        fVar30 = fVar7 * fVar26 + fVar35;
        fVar31 = fVar8 * fVar26 + fVar36;
        fVar26 = fVar9 * fVar26 + fVar37;
        auVar1 = vhaddps_avx(auVar25,auVar25);
        auVar28._0_4_ = fVar38 * fVar27 * fVar27;
        auVar28._4_4_ = fVar39 * fVar30 * fVar30;
        auVar28._8_4_ = fVar40 * fVar31 * fVar31;
        auVar28._12_4_ = fVar41 * fVar26 * fVar26;
        auVar22 = vshufpd_avx(auVar28,auVar28,1);
        auVar29._0_4_ = auVar28._0_4_ + auVar22._0_4_;
        auVar29._4_4_ = auVar28._4_4_ + auVar22._4_4_;
        auVar29._8_4_ = auVar28._8_4_ + auVar22._8_4_;
        auVar29._12_4_ = auVar28._12_4_ + auVar22._12_4_;
        auVar22 = vhaddps_avx(auVar29,auVar29);
        fVar21 = fVar6 * fVar32 + fVar21;
        fVar35 = fVar7 * fVar32 + fVar35;
        fVar36 = fVar8 * fVar32 + fVar36;
        fVar37 = fVar9 * fVar32 + fVar37;
        auVar33._0_4_ = fVar38 * fVar21 * fVar21;
        auVar33._4_4_ = fVar39 * fVar35 * fVar35;
        auVar33._8_4_ = fVar40 * fVar36 * fVar36;
        auVar33._12_4_ = fVar41 * fVar37 * fVar37;
        auVar23 = vshufpd_avx(auVar33,auVar33,1);
        auVar34._0_4_ = auVar33._0_4_ + auVar23._0_4_;
        auVar34._4_4_ = auVar33._4_4_ + auVar23._4_4_;
        auVar34._8_4_ = auVar33._8_4_ + auVar23._8_4_;
        auVar34._12_4_ = auVar33._12_4_ + auVar23._12_4_;
        auVar23 = vhaddps_avx(auVar34,auVar34);
        if ((((auVar23._0_4_ < auVar1._0_4_) && (bVar17 < 0x40)) &&
            (uVar18 = (uint)(uVar4 >> 8), auVar23._0_4_ < auVar22._0_4_)) ||
           ((bVar17 != 0 && (uVar18 = (uint)uVar4, auVar22._0_4_ < auVar1._0_4_)))) {
          puVar15[uVar14] = (uint8_t)uVar18;
          bVar10 = true;
        }
        bVar17 = bsd->texel_count;
      }
      puVar15 = puVar15 + 0x20;
      auVar5 = auVar5 ^ auVar19;
      iVar11 = iVar11 + 1;
    }
    __assertion = "bsd.texel_count > 0";
    uVar18 = 0x7d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                ,uVar18,
                "bool realign_weights_undecimated(astcenc_profile, const block_size_descriptor &, const image_block &, symbolic_compressed_block &)"
               );
}

Assistant:

static bool realign_weights_undecimated(
	astcenc_profile decode_mode,
	const block_size_descriptor& bsd,
	const image_block& blk,
	symbolic_compressed_block& scb
) {
	// Get the partition descriptor
	unsigned int partition_count = scb.partition_count;
	const auto& pi = bsd.get_partition_info(partition_count, scb.partition_index);

	// Get the quantization table
	const block_mode& bm = bsd.get_block_mode(scb.block_mode);
	unsigned int weight_quant_level = bm.quant_mode;
	const quant_and_transfer_table& qat = quant_and_xfer_tables[weight_quant_level];

	unsigned int max_plane = bm.is_dual_plane;
	int plane2_component = scb.plane2_component;
	vmask4 plane_mask = vint4::lane_id() == vint4(plane2_component);

	// Decode the color endpoints
	bool rgb_hdr;
	bool alpha_hdr;
	vint4 endpnt0[BLOCK_MAX_PARTITIONS];
	vint4 endpnt1[BLOCK_MAX_PARTITIONS];
	vfloat4 endpnt0f[BLOCK_MAX_PARTITIONS];
	vfloat4 offset[BLOCK_MAX_PARTITIONS];

	promise(partition_count > 0);

	for (unsigned int pa_idx = 0; pa_idx < partition_count; pa_idx++)
	{
		unpack_color_endpoints(decode_mode,
		                       scb.color_formats[pa_idx],
		                       scb.color_values[pa_idx],
		                       rgb_hdr, alpha_hdr,
		                       endpnt0[pa_idx],
		                       endpnt1[pa_idx]);
	}

	uint8_t* dec_weights_uquant = scb.weights;
	bool adjustments = false;

	// For each plane and partition ...
	for (unsigned int pl_idx = 0; pl_idx <= max_plane; pl_idx++)
	{
		for (unsigned int pa_idx = 0; pa_idx < partition_count; pa_idx++)
		{
			// Compute the endpoint delta for all components in current plane
			vint4 epd = endpnt1[pa_idx] - endpnt0[pa_idx];
			epd = select(epd, vint4::zero(), plane_mask);

			endpnt0f[pa_idx] = int_to_float(endpnt0[pa_idx]);
			offset[pa_idx] = int_to_float(epd) * (1.0f / 64.0f);
		}

		// For each weight compute previous, current, and next errors
		promise(bsd.texel_count > 0);
		for (unsigned int texel = 0; texel < bsd.texel_count; texel++)
		{
			int uqw = dec_weights_uquant[texel];

			uint32_t prev_and_next = qat.prev_next_values[uqw];
			int uqw_down = prev_and_next & 0xFF;
			int uqw_up = (prev_and_next >> 8) & 0xFF;

			// Interpolate the colors to create the diffs
			float weight_base = static_cast<float>(uqw);
			float weight_down = static_cast<float>(uqw_down - uqw);
			float weight_up = static_cast<float>(uqw_up - uqw);

			unsigned int partition = pi.partition_of_texel[texel];
			vfloat4 color_offset = offset[partition];
			vfloat4 color_base   = endpnt0f[partition];

			vfloat4 color = color_base + color_offset * weight_base;
			vfloat4 orig_color   = blk.texel(texel);
			vfloat4 error_weight = blk.channel_weight;

			vfloat4 color_diff      = color - orig_color;
			vfloat4 color_diff_down = color_diff + color_offset * weight_down;
			vfloat4 color_diff_up   = color_diff + color_offset * weight_up;

			float error_base = dot_s(color_diff      * color_diff,      error_weight);
			float error_down = dot_s(color_diff_down * color_diff_down, error_weight);
			float error_up   = dot_s(color_diff_up   * color_diff_up,   error_weight);

			// Check if the prev or next error is better, and if so use it
			if ((error_up < error_base) && (error_up < error_down) && (uqw < 64))
			{
				dec_weights_uquant[texel] = static_cast<uint8_t>(uqw_up);
				adjustments = true;
			}
			else if ((error_down < error_base) && (uqw > 0))
			{
				dec_weights_uquant[texel] = static_cast<uint8_t>(uqw_down);
				adjustments = true;
			}
		}

		// Prepare iteration for plane 2
		dec_weights_uquant += WEIGHTS_PLANE2_OFFSET;
		plane_mask = ~plane_mask;
	}

	return adjustments;
}